

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

void __thiscall
kj::TlsConnection::TlsConnection(TlsConnection *this,AsyncIoStream *stream,SSL_CTX *ctx)

{
  SSL *pSVar1;
  BIO_METHOD *type;
  BIO *rbio;
  
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_0064d230;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_0064d2c8;
  this->inner = stream;
  (this->ownInner).disposer = (Disposer *)0x0;
  (this->ownInner).ptr = (AsyncIoStream *)0x0;
  (this->shutdownTask).ptr.isSet = false;
  ReadyInputStreamWrapper::ReadyInputStreamWrapper
            (&this->readBuffer,&stream->super_AsyncInputStream);
  ReadyOutputStreamWrapper::ReadyOutputStreamWrapper
            (&this->writeBuffer,&stream->super_AsyncOutputStream);
  pSVar1 = SSL_new((SSL_CTX *)ctx);
  this->ssl = (SSL *)pSVar1;
  if (pSVar1 == (SSL *)0x0) {
    anon_unknown_312::throwOpensslError();
  }
  type = (BIO_METHOD *)getBioVtable();
  rbio = BIO_new(type);
  if (rbio != (BIO *)0x0) {
    BIO_set_data(rbio,this);
    BIO_set_init(rbio,1);
    SSL_set_bio((SSL *)this->ssl,rbio,rbio);
    return;
  }
  SSL_free((SSL *)this->ssl);
  anon_unknown_312::throwOpensslError();
}

Assistant:

TlsConnection(kj::AsyncIoStream& stream, SSL_CTX* ctx)
      : inner(stream), readBuffer(stream), writeBuffer(stream) {
    ssl = SSL_new(ctx);
    if (ssl == nullptr) {
      throwOpensslError();
    }

    BIO* bio = BIO_new(const_cast<BIO_METHOD*>(getBioVtable()));
    if (bio == nullptr) {
      SSL_free(ssl);
      throwOpensslError();
    }

    BIO_set_data(bio, this);
    BIO_set_init(bio, 1);
    SSL_set_bio(ssl, bio, bio);
  }